

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O2

void ** __thiscall QThreadStorageData::get(QThreadStorageData *this)

{
  QThreadData *pQVar1;
  pointer ppvVar2;
  long lVar3;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QThreadData::current();
  if (pQVar1 == (QThreadData *)0x0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    ppvVar2 = (pointer)0x0;
    QMessageLogger::warning
              (&local_40,
               "QThreadStorage::get: QThreadStorage can only be used with threads started with QThread"
              );
  }
  else {
    lVar3 = (long)this->id;
    if ((pQVar1->tls).d.size <= lVar3) {
      QList<void_*>::resize(&pQVar1->tls,(long)(this->id + 1));
      lVar3 = (long)this->id;
    }
    ppvVar2 = QList<void_*>::data(&pQVar1->tls);
    ppvVar2 = ppvVar2 + lVar3;
    if (*ppvVar2 == (void *)0x0) {
      ppvVar2 = (pointer)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return ppvVar2;
  }
  __stack_chk_fail();
}

Assistant:

void **QThreadStorageData::get() const
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::get: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);
    void **v = &tls[id];

    DEBUG_MSG("QThreadStorageData: Returning storage %d, data %p, for thread %p",
          id,
          *v,
          data->thread.loadRelaxed());

    return *v ? v : nullptr;
}